

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ShaderAllocator::setSource
          (ShaderAllocator *this,ShaderType shaderType)

{
  mapped_type *ppSVar1;
  char *cSource;
  string source;
  long *local_48;
  ShaderType local_3c;
  long *local_38 [2];
  long local_28 [2];
  
  local_3c = shaderType;
  (*this->m_srcGen->_vptr_SourceGenerator[2])(local_38,this->m_srcGen,shaderType);
  local_48 = local_38[0];
  ppSVar1 = std::
            map<glu::ShaderType,_glu::Shader_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
            ::operator[](&this->m_shaders,&local_3c);
  glu::Shader::setSources(*ppSVar1,1,(char **)&local_48,(int *)0x0);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void ShaderAllocator::setSource (const glu::ShaderType shaderType)
{
	DE_ASSERT(this->hasShader(shaderType));
	DE_ASSERT(!m_srcGen.finished(shaderType));

	const std::string	source	= m_srcGen.next(shaderType);
	const char* const	cSource	= source.c_str();

	m_shaders[shaderType]->setSources(1, &cSource, 0);
}